

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O2

SmallBuffer * __thiscall
helics::typeConvert(SmallBuffer *__return_storage_ptr__,helics *this,DataType type,string_view str,
                   double val)

{
  value_t vVar1;
  json_value jVar2;
  char *pcVar3;
  string *val_00;
  reference pvVar4;
  undefined4 in_register_00000014;
  DataType type_00;
  string_view valname;
  string_view valname_00;
  string_view pointName;
  string_view val_01;
  allocator<char> local_91;
  complex<double> cval;
  json json;
  double val_local;
  data local_50;
  data local_40;
  data local_30;
  string_view str_local;
  
  val_01._M_len = (helics *)CONCAT44(in_register_00000014,type);
  pointName._M_str = (char *)str._M_len;
  type_00 = (DataType)this;
  val_local = val;
  str_local._M_len = (size_t)val_01._M_len;
  str_local._M_str = pointName._M_str;
  if (type_00 == HELICS_NAMED_POINT) {
    valname._M_str = pointName._M_str;
    valname._M_len = (size_t)val_01._M_len;
    NamedPoint::NamedPoint((NamedPoint *)&cval,valname,val);
    ValueConverter<helics::NamedPoint>::convert(__return_storage_ptr__,(NamedPoint *)&cval);
    goto LAB_001e854b;
  }
  if (NAN(val)) {
    val_01._M_str = pointName._M_str;
    typeConvert(__return_storage_ptr__,type_00,val_01);
    return __return_storage_ptr__;
  }
  switch((ulong)this & 0xffffffff) {
  case 0:
  case 9:
    pointName._M_len = (size_t)pointName._M_str;
    helicsNamedPointString_abi_cxx11_((string *)&cval,val_01._M_len,pointName,val);
    json.m_data._0_8_ = cval._M_value._8_8_;
    json.m_data.m_value = (json_value)cval._M_value._0_8_;
    ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
              (__return_storage_ptr__,(basic_string_view<char,_std::char_traits<char>_> *)&json);
    goto LAB_001e854b;
  case 1:
    ValueConverter<double>::convert(__return_storage_ptr__,&val_local);
    break;
  case 2:
  case 8:
    cval._M_value._0_8_ = (BADTYPE)val;
    ValueConverter<long>::convert(__return_storage_ptr__,(long *)&cval);
    break;
  case 3:
    cval._M_value._8_8_ = 0;
    cval._M_value._0_8_ = val;
    ValueConverter<std::complex<double>_>::convert(__return_storage_ptr__,&cval);
    break;
  case 4:
    ValueConverter<double>::convert(__return_storage_ptr__,&val_local,1);
    break;
  case 5:
    cval._M_value._8_8_ = 0;
    cval._M_value._0_8_ = val;
    ValueConverter<std::complex<double>_>::convert(__return_storage_ptr__,&cval,1);
    break;
  case 7:
    pcVar3 = "+0";
    if (val != 0.0) {
      pcVar3 = "*1";
    }
    if (NAN(val)) {
      pcVar3 = "*1";
    }
    cval._M_value._8_8_ = pcVar3 + 1;
    cval._M_value._0_8_ = 1;
    ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
              (__return_storage_ptr__,(basic_string_view<char,_std::char_traits<char>_> *)&cval);
    break;
  default:
    if (type_00 == HELICS_JSON) {
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json(&json,(nullptr_t)0x0);
      val_00 = typeNameStringRef_abi_cxx11_(HELICS_NAMED_POINT);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_30,val_00);
      pvVar4 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&json,"type");
      vVar1 = (pvVar4->m_data).m_type;
      (pvVar4->m_data).m_type = local_30.m_type;
      jVar2 = (pvVar4->m_data).m_value;
      (pvVar4->m_data).m_value = local_30.m_value;
      local_30.m_type = vVar1;
      local_30.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_30);
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&cval,&str_local,&local_91);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cval);
      pvVar4 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&json,"name");
      vVar1 = (pvVar4->m_data).m_type;
      (pvVar4->m_data).m_type = local_40.m_type;
      jVar2 = (pvVar4->m_data).m_value;
      (pvVar4->m_data).m_value = local_40.m_value;
      local_40.m_type = vVar1;
      local_40.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_40);
      std::__cxx11::string::~string((string *)&cval);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json<double_&,_double,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_50,&val_local);
      pvVar4 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&json,"value");
      vVar1 = (pvVar4->m_data).m_type;
      (pvVar4->m_data).m_type = local_50.m_type;
      jVar2 = (pvVar4->m_data).m_value;
      (pvVar4->m_data).m_value = local_50.m_value;
      local_50.m_type = vVar1;
      local_50.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_50);
      fileops::generateJsonString((string *)&cval,&json,true);
      SmallBuffer::SmallBuffer<std::__cxx11::string,void>
                (__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cval);
      std::__cxx11::string::~string((string *)&cval);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&json.m_data);
      return __return_storage_ptr__;
    }
  case 6:
    valname_00._M_str = pointName._M_str;
    valname_00._M_len = (size_t)val_01._M_len;
    NamedPoint::NamedPoint((NamedPoint *)&cval,valname_00,val);
    ValueConverter<helics::NamedPoint>::convert(__return_storage_ptr__,(NamedPoint *)&cval);
LAB_001e854b:
    std::__cxx11::string::~string((string *)&cval);
  }
  return __return_storage_ptr__;
}

Assistant:

SmallBuffer typeConvert(DataType type, std::string_view str, double val)
{
    if (type == DataType::HELICS_NAMED_POINT) {
        return ValueConverter<NamedPoint>::convert(NamedPoint(str, val));
    }
    if (std::isnan(val)) {
        // just convert the string
        return typeConvert(type, str);
    }
    switch (type) {
        case DataType::HELICS_DOUBLE:
            return ValueConverter<double>::convert(val);
        case DataType::HELICS_INT:
        case DataType::HELICS_TIME:
            return ValueConverter<int64_t>::convert(static_cast<int64_t>(val));
        case DataType::HELICS_COMPLEX:
            return ValueConverter<std::complex<double>>::convert(std::complex<double>(val, 0.0));
        case DataType::HELICS_BOOL:
            return ValueConverter<std::string_view>::convert((val != 0.0) ? "1" : "0");
        case DataType::HELICS_NAMED_POINT:
        default:
            return ValueConverter<NamedPoint>::convert(NamedPoint(str, val));
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
            return ValueConverter<std::string_view>::convert(helicsNamedPointString(str, val));
        case DataType::HELICS_COMPLEX_VECTOR: {
            const std::complex<double> cval(val, 0.0);
            return ValueConverter<std::complex<double>>::convert(&cval, 1);
        }
        case DataType::HELICS_VECTOR:
            return ValueConverter<double>::convert(&(val), 1);
        case DataType::HELICS_JSON: {
            nlohmann::json json;
            json["type"] = typeNameStringRef(DataType::HELICS_NAMED_POINT);
            json["name"] = std::string(str);
            json["value"] = val;
            return fileops::generateJsonString(json);
        }
    }
}